

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O0

void __thiscall cmCommandArgument::ApplyOwnGroup(cmCommandArgument *this)

{
  bool bVar1;
  reference ppcVar2;
  __normal_iterator<cmCommandArgument_**,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
  local_28;
  __normal_iterator<cmCommandArgument_**,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
  local_20;
  __normal_iterator<cmCommandArgument_*const_*,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
  local_18;
  const_iterator it;
  cmCommandArgument *this_local;
  
  if (this->Group != (cmCommandArgumentGroup *)0x0) {
    it._M_current = (cmCommandArgument **)this;
    local_20._M_current =
         (cmCommandArgument **)
         std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>::begin
                   (&this->Group->ContainedArguments);
    __gnu_cxx::
    __normal_iterator<cmCommandArgument*const*,std::vector<cmCommandArgument*,std::allocator<cmCommandArgument*>>>
    ::__normal_iterator<cmCommandArgument**>
              ((__normal_iterator<cmCommandArgument*const*,std::vector<cmCommandArgument*,std::allocator<cmCommandArgument*>>>
                *)&local_18,&local_20);
    while( true ) {
      local_28._M_current =
           (cmCommandArgument **)
           std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>::end
                     (&this->Group->ContainedArguments);
      bVar1 = __gnu_cxx::operator!=(&local_18,&local_28);
      if (!bVar1) break;
      ppcVar2 = __gnu_cxx::
                __normal_iterator<cmCommandArgument_*const_*,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
                ::operator*(&local_18);
      if (*ppcVar2 != this) {
        ppcVar2 = __gnu_cxx::
                  __normal_iterator<cmCommandArgument_*const_*,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
                  ::operator*(&local_18);
        std::
        set<const_cmCommandArgument_*,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
        ::insert(&this->ArgumentsBefore,ppcVar2);
      }
      __gnu_cxx::
      __normal_iterator<cmCommandArgument_*const_*,_std::vector<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>_>
      ::operator++(&local_18);
    }
  }
  return;
}

Assistant:

void cmCommandArgument::ApplyOwnGroup()
{
  if (this->Group!=0)
    {
    for (std::vector<cmCommandArgument*>::const_iterator
         it = this->Group->ContainedArguments.begin();
         it != this->Group->ContainedArguments.end();
         ++it)
      {
      if(*it != this)
        {
        this->ArgumentsBefore.insert(*it);
        }
      }
    }
}